

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O1

tool_mime *
tool_mime_new_filedata(tool_mime *parent,char *filename,_Bool isremotefile,CURLcode *errcode)

{
  bool bVar1;
  int iVar2;
  ParameterError PVar3;
  char *__ptr;
  tool_mime *ptVar4;
  long lVar5;
  CURLcode CVar6;
  size_t stdinsize;
  stat sbuf;
  char *local_d8;
  long local_d0;
  size_t local_c8;
  stat64 local_c0;
  
  *errcode = CURLE_OUT_OF_MEMORY;
  iVar2 = strcmp(filename,"-");
  if (iVar2 == 0) {
    iVar2 = fileno(_stdin);
    local_d8 = (char *)0x0;
    lVar5 = ftell(_stdin);
    if (((lVar5 < 0 || iVar2 < 0) || (iVar2 = fstat64(iVar2,&local_c0), iVar2 != 0)) ||
       ((local_c0.st_mode & 0xf000) != 0x8000)) {
      local_c8 = 0;
      PVar3 = file2memory(&local_d8,&local_c8,(FILE *)_stdin);
      if (PVar3 == PARAM_OK) {
        iVar2 = ferror(_stdin);
        if (iVar2 == 0) {
          CVar6 = CURLE_OK;
          if (local_c8 == 0) {
            local_d8 = strdup("");
            CVar6 = CURLE_OK;
            if (local_d8 == (char *)0x0) goto LAB_0010e2bf;
          }
        }
        else {
          free(local_d8);
          local_d8 = (char *)0x0;
          CVar6 = CURLE_READ_ERROR;
        }
        local_d0 = curlx_uztoso(local_c8);
        bVar1 = true;
        lVar5 = 0;
      }
      else {
LAB_0010e2bf:
        CVar6 = CURLE_OK;
        bVar1 = false;
      }
      if (!bVar1) goto LAB_0010e39f;
    }
    else {
      CVar6 = CURLE_OK;
      local_d0 = local_c0.st_size - lVar5;
      if (local_c0.st_size - lVar5 < 1) {
        local_d0 = 0;
      }
    }
    ptVar4 = (tool_mime *)calloc(1,0x70);
    if (ptVar4 != (tool_mime *)0x0) {
      ptVar4->kind = TOOLMIME_STDIN;
      ptVar4->parent = parent;
      if (parent != (tool_mime *)0x0) {
        ptVar4->prev = parent->subparts;
        parent->subparts = ptVar4;
      }
      if (ptVar4 != (tool_mime *)0x0) {
        ptVar4->data = local_d8;
        ptVar4->origin = lVar5;
        ptVar4->size = local_d0;
        ptVar4->curpos = 0;
        if (!isremotefile) {
          ptVar4->kind = TOOLMIME_STDINDATA;
        }
        *errcode = CVar6;
        return ptVar4;
      }
    }
    free(local_d8);
  }
  else {
    __ptr = strdup(filename);
    if (__ptr != (char *)0x0) {
      ptVar4 = (tool_mime *)calloc(1,0x70);
      if (ptVar4 != (tool_mime *)0x0) {
        ptVar4->kind = TOOLMIME_FILE;
        ptVar4->parent = parent;
        if (parent != (tool_mime *)0x0) {
          ptVar4->prev = parent->subparts;
          parent->subparts = ptVar4;
        }
        if (ptVar4 != (tool_mime *)0x0) {
          ptVar4->data = __ptr;
          if (!isremotefile) {
            ptVar4->kind = TOOLMIME_FILEDATA;
          }
          *errcode = CURLE_OK;
          return ptVar4;
        }
      }
      free(__ptr);
    }
LAB_0010e39f:
    ptVar4 = (tool_mime *)0x0;
  }
  return ptVar4;
}

Assistant:

static struct tool_mime *tool_mime_new_filedata(struct tool_mime *parent,
                                                const char *filename,
                                                bool isremotefile,
                                                CURLcode *errcode)
{
  CURLcode result = CURLE_OK;
  struct tool_mime *m = NULL;

  *errcode = CURLE_OUT_OF_MEMORY;
  if(strcmp(filename, "-")) {
    /* This is a normal file. */
    filename = strdup(filename);
    if(filename) {
      m = tool_mime_new(parent, TOOLMIME_FILE);
      if(!m)
        CONST_FREE(filename);
      else {
        m->data = filename;
        if(!isremotefile)
          m->kind = TOOLMIME_FILEDATA;
       *errcode = CURLE_OK;
      }
    }
  }
  else {        /* Standard input. */
    int fd = fileno(stdin);
    char *data = NULL;
    curl_off_t size;
    curl_off_t origin;
    struct_stat sbuf;

    set_binmode(stdin);
    origin = ftell(stdin);
    /* If stdin is a regular file, do not buffer data but read it
       when needed. */
    if(fd >= 0 && origin >= 0 && !fstat(fd, &sbuf) &&
#ifdef __VMS
       sbuf.st_fab_rfm != FAB$C_VAR && sbuf.st_fab_rfm != FAB$C_VFC &&
#endif
       S_ISREG(sbuf.st_mode)) {
      size = sbuf.st_size - origin;
      if(size < 0)
        size = 0;
    }
    else {  /* Not suitable for direct use, buffer stdin data. */
      size_t stdinsize = 0;

      if(file2memory(&data, &stdinsize, stdin) != PARAM_OK) {
        /* Out of memory. */
        return m;
      }

      if(ferror(stdin)) {
        result = CURLE_READ_ERROR;
        Curl_safefree(data);
        data = NULL;
      }
      else if(!stdinsize) {
        /* Zero-length data has been freed. Re-create it. */
        data = strdup("");
        if(!data)
          return m;
      }
      size = curlx_uztoso(stdinsize);
      origin = 0;
    }
    m = tool_mime_new(parent, TOOLMIME_STDIN);
    if(!m)
      Curl_safefree(data);
    else {
      m->data = data;
      m->origin = origin;
      m->size = size;
      m->curpos = 0;
      if(!isremotefile)
        m->kind = TOOLMIME_STDINDATA;
      *errcode = result;
    }
  }
  return m;
}